

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::TracingServiceState_TracingSession::TracingServiceState_TracingSession
          (TracingServiceState_TracingSession *this)

{
  TracingServiceState_TracingSession *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TracingServiceState_TracingSession_009c1030;
  this->id_ = 0;
  this->consumer_uid_ = 0;
  ::std::__cxx11::string::string((string *)&this->state_);
  ::std::__cxx11::string::string((string *)&this->unique_session_name_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->buffer_size_kb_);
  this->duration_ms_ = 0;
  this->num_data_sources_ = 0;
  this->start_realtime_ns_ = 0;
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<9UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

TracingServiceState_TracingSession::TracingServiceState_TracingSession() = default;